

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O0

void __thiscall FNotifyBuffer::Draw(FNotifyBuffer *this)

{
  bool bVar1;
  FFont *pFVar2;
  DFrameBuffer *pDVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  FNotifyText *pFVar15;
  char *pcVar16;
  double local_58;
  double alpha;
  FNotifyText *notify;
  uint i;
  int iStack_20;
  bool canskip;
  int j;
  int color;
  int lineadv;
  int line;
  bool center;
  FNotifyBuffer *this_local;
  
  bVar4 = FBoolCVar::operator_cast_to_bool(&con_centernotify);
  bVar4 = (float)bVar4 != 0.0;
  if ((gamestate != GS_FULLCONSOLE) && (gamestate != GS_DEMOSCREEN)) {
    color = this->Top;
    bVar1 = true;
    j = FFont::GetHeight(SmallFont);
    iVar6 = active_con_scaletext();
    if (iVar6 == 0) {
      j = CleanYfac * j;
    }
    BorderTopRefresh =
         (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x20])();
    for (notify._4_4_ = 0; uVar7 = TArray<FNotifyText,_FNotifyText>::Size(&this->Text),
        notify._4_4_ < uVar7; notify._4_4_ = notify._4_4_ + 1) {
      pFVar15 = TArray<FNotifyText,_FNotifyText>::operator[](&this->Text,(ulong)notify._4_4_);
      if (pFVar15->TimeOut != 0) {
        iVar6 = pFVar15->TimeOut - gametic;
        if (iVar6 < 1) {
          if (bVar1) {
            this->Top = j + this->Top;
            color = j + color;
          }
          pFVar15->TimeOut = 0;
        }
        else {
          bVar5 = FBoolCVar::operator_cast_to_bool(&show_messages);
          if ((bVar5) || (pFVar15->PrintLevel == 0x80)) {
            if (iVar6 < 6) {
              local_58 = ((double)iVar6 * 1.0) / 6.0;
            }
            else {
              local_58 = 1.0;
            }
            if (pFVar15->PrintLevel < 5) {
              iStack_20 = PrintColors[pFVar15->PrintLevel];
            }
            else {
              iStack_20 = 0xb;
            }
            iVar6 = active_con_scaletext();
            pDVar3 = screen;
            pFVar2 = SmallFont;
            if (iVar6 == 0) {
              if (bVar4) {
                iVar6 = DCanvas::GetWidth((DCanvas *)screen);
                iVar8 = FFont::StringWidth(SmallFont,&pFVar15->Text);
                iVar8 = iVar8 * CleanXfac;
                pcVar16 = FString::operator_cast_to_char_(&pFVar15->Text);
                DCanvas::DrawText((DCanvas *)pDVar3,pFVar2,iStack_20,(iVar6 - iVar8) / 2,color,
                                  pcVar16,0x40001393,local_58,1,0x4000138c,0);
              }
              else {
                pcVar16 = FString::operator_cast_to_char_(&pFVar15->Text);
                DCanvas::DrawText((DCanvas *)pDVar3,pFVar2,iStack_20,0,color,pcVar16,0x40001393,
                                  local_58,1,0x4000138c,0);
              }
            }
            else {
              iVar6 = active_con_scaletext();
              pDVar3 = screen;
              pFVar2 = SmallFont;
              if (iVar6 == 1) {
                if (bVar4) {
                  iVar6 = DCanvas::GetWidth((DCanvas *)screen);
                  iVar8 = FFont::StringWidth(SmallFont,&pFVar15->Text);
                  pcVar16 = FString::operator_cast_to_char_(&pFVar15->Text);
                  DCanvas::DrawText((DCanvas *)pDVar3,pFVar2,iStack_20,(iVar6 - iVar8) / 2,color,
                                    pcVar16,0x4000138c,local_58,0);
                }
                else {
                  pcVar16 = FString::operator_cast_to_char_(&pFVar15->Text);
                  DCanvas::DrawText((DCanvas *)pDVar3,pFVar2,iStack_20,0,color,pcVar16,0x4000138c,
                                    local_58,0);
                }
              }
              else if (bVar4) {
                iVar6 = DCanvas::GetWidth((DCanvas *)screen);
                iVar8 = FFont::StringWidth(SmallFont,&pFVar15->Text);
                iVar9 = active_con_scaletext();
                iVar10 = active_con_scaletext();
                pcVar16 = FString::operator_cast_to_char_(&pFVar15->Text);
                iVar11 = DCanvas::GetWidth((DCanvas *)screen);
                iVar12 = active_con_scaletext();
                iVar13 = DCanvas::GetHeight((DCanvas *)screen);
                iVar14 = active_con_scaletext();
                DCanvas::DrawText((DCanvas *)pDVar3,pFVar2,iStack_20,
                                  ((iVar6 - iVar8 * iVar9) / 2) / iVar10,color,pcVar16,0x40001399,
                                  local_58,iVar11 / iVar12,0x4000139a,iVar13 / iVar14,0x400013a8,1,
                                  0x4000138c,0);
              }
              else {
                pcVar16 = FString::operator_cast_to_char_(&pFVar15->Text);
                iVar6 = DCanvas::GetWidth((DCanvas *)screen);
                iVar8 = active_con_scaletext();
                iVar9 = DCanvas::GetHeight((DCanvas *)screen);
                iVar10 = active_con_scaletext();
                DCanvas::DrawText((DCanvas *)pDVar3,pFVar2,iStack_20,0,color,pcVar16,0x40001399,
                                  local_58,iVar6 / iVar8,0x4000139a,iVar9 / iVar10,0x400013a8,1,
                                  0x4000138c,0);
              }
            }
            color = j + color;
            bVar1 = false;
          }
        }
      }
    }
    if (bVar1) {
      this->Top = this->TopGoal;
    }
  }
  return;
}

Assistant:

void FNotifyBuffer::Draw()
{
	bool center = (con_centernotify != 0.f);
	int line, lineadv, color, j;
	bool canskip;
	
	if (gamestate == GS_FULLCONSOLE || gamestate == GS_DEMOSCREEN/* || menuactive != MENU_Off*/)
		return;

	line = Top;
	canskip = true;

	lineadv = SmallFont->GetHeight ();
	if (active_con_scaletext() == 0)
	{
		lineadv *= CleanYfac;
	}

	BorderTopRefresh = screen->GetPageCount ();

	for (unsigned i = 0; i < Text.Size(); ++ i)
	{
		FNotifyText &notify = Text[i];

		if (notify.TimeOut == 0)
			continue;

		j = notify.TimeOut - gametic;
		if (j > 0)
		{
			if (!show_messages && notify.PrintLevel != 128)
				continue;

			double alpha = (j < NOTIFYFADETIME) ? 1. * j / NOTIFYFADETIME : 1;

			if (notify.PrintLevel >= PRINTLEVELS)
				color = CR_UNTRANSLATED;
			else
				color = PrintColors[notify.PrintLevel];

			if (active_con_scaletext() == 0)
			{
				if (!center)
					screen->DrawText (SmallFont, color, 0, line, notify.Text,
						DTA_CleanNoMove, true, DTA_AlphaF, alpha, TAG_DONE);
				else
					screen->DrawText (SmallFont, color, (SCREENWIDTH -
						SmallFont->StringWidth (notify.Text)*CleanXfac)/2,
						line, notify.Text, DTA_CleanNoMove, true,
						DTA_AlphaF, alpha, TAG_DONE);
			}
			else if (active_con_scaletext() == 1)
			{
				if (!center)
					screen->DrawText (SmallFont, color, 0, line, notify.Text,
						DTA_AlphaF, alpha, TAG_DONE);
				else
					screen->DrawText (SmallFont, color, (SCREENWIDTH -
						SmallFont->StringWidth (notify.Text))/2,
						line, notify.Text,
						DTA_AlphaF, alpha, TAG_DONE);
			}
			else
			{
				if (!center)
					screen->DrawText (SmallFont, color, 0, line, notify.Text,
						DTA_VirtualWidth, screen->GetWidth() / active_con_scaletext(),
						DTA_VirtualHeight, screen->GetHeight() / active_con_scaletext(),
						DTA_KeepRatio, true,
						DTA_AlphaF, alpha, TAG_DONE);
				else
					screen->DrawText (SmallFont, color, (screen->GetWidth() -
						SmallFont->StringWidth (notify.Text) * active_con_scaletext()) / 2 / active_con_scaletext(),
						line, notify.Text,
						DTA_VirtualWidth, screen->GetWidth() / active_con_scaletext(),
						DTA_VirtualHeight, screen->GetHeight() / active_con_scaletext(),
						DTA_KeepRatio, true,
						DTA_AlphaF, alpha, TAG_DONE);
			}
			line += lineadv;
			canskip = false;
		}
		else
		{
			if (canskip)
			{
				Top += lineadv;
				line += lineadv;
			}
			notify.TimeOut = 0;
		}
	}
	if (canskip)
	{
		Top = TopGoal;
	}
}